

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_highbd_quantize_sse4.c
# Opt level: O0

void av1_highbd_quantize_fp_sse4_1
               (tran_low_t *coeff_ptr,intptr_t count,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan,int log_scale)

{
  uint16_t uVar1;
  int shift_00;
  longlong *plVar2;
  tran_low_t *qAddr;
  short *in_RCX;
  long in_RSI;
  longlong *in_RDI;
  short *in_R8;
  tran_low_t *in_stack_00000008;
  tran_low_t *in_stack_00000010;
  short *in_stack_00000018;
  uint16_t *in_stack_00000020;
  int round0;
  int round1;
  int quan_stride;
  int coeff_stride;
  int shift;
  tran_low_t *dquanAddr;
  tran_low_t *quanAddr;
  tran_low_t *src;
  __m128i eob;
  __m128i coeff_sign;
  __m128i qparam [4];
  __m128i dequant [2];
  __m128i qcoeff [3];
  __m128i coeff [2];
  tran_low_t *local_280;
  tran_low_t *local_278;
  longlong *local_270;
  longlong local_268 [4];
  int local_248;
  int iStack_244;
  int iStack_240;
  int iStack_23c;
  ulong local_238;
  ulong uStack_230;
  ulong local_228;
  ulong uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  longlong local_208 [4];
  longlong local_1e8 [6];
  longlong local_1b8;
  longlong lStack_1b0;
  longlong local_1a8;
  longlong lStack_1a0;
  short *local_190;
  short *local_188;
  long local_178;
  undefined8 local_168;
  undefined8 uStack_160;
  longlong *local_158;
  longlong *local_150;
  longlong *local_148;
  undefined8 local_138;
  undefined8 uStack_130;
  int local_128;
  int local_124;
  int local_120;
  int local_11c;
  int local_118;
  int iStack_114;
  int iStack_110;
  int iStack_10c;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  ulong local_f8;
  ulong uStack_f0;
  ulong local_e8;
  ulong local_e0;
  ulong local_d8;
  ulong uStack_d0;
  ulong local_c8;
  ulong local_c0;
  int local_b8;
  int iStack_b4;
  int iStack_ac;
  undefined4 local_a8;
  int iStack_a4;
  undefined4 uStack_a0;
  int iStack_9c;
  undefined4 uStack_98;
  ulong local_90;
  ulong local_88;
  ulong uStack_80;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong uStack_50;
  ulong local_40;
  ulong local_38;
  int local_2c;
  undefined8 local_28;
  undefined8 uStack_20;
  int local_10;
  int local_c;
  int local_8;
  int local_4;
  
  local_168 = 0;
  uStack_160 = 0;
  local_268[0] = 0;
  local_268[1] = 0;
  local_278 = in_stack_00000008;
  local_280 = in_stack_00000010;
  shift_00 = 0x10 - (int)dquanAddr;
  local_190 = in_R8;
  local_188 = in_RCX;
  local_178 = in_RSI;
  memset(in_stack_00000008,0,in_RSI << 2);
  memset(in_stack_00000010,0,local_178 << 2);
  local_1b8 = *in_RDI;
  lStack_1b0 = in_RDI[1];
  local_104 = (int)local_188[1] + ((1 << ((byte)dquanAddr & 0x1f)) >> 1) >> ((byte)dquanAddr & 0x1f)
  ;
  local_108 = (int)*local_188 + ((1 << ((byte)dquanAddr & 0x1f)) >> 1) >> ((byte)dquanAddr & 0x1f);
  uStack_230 = (ulong)(uint)(int)local_190[1];
  local_238 = (ulong)(uint)(int)*local_190;
  uStack_220 = (ulong)(uint)(int)in_stack_00000018[1];
  local_228 = (ulong)(uint)(int)*in_stack_00000018;
  local_124 = (int)in_stack_00000018[1];
  local_128 = (int)*in_stack_00000018;
  local_218 = CONCAT44(local_124,local_128);
  uStack_210 = CONCAT44(local_124,local_124);
  local_138 = local_218;
  uStack_130 = uStack_210;
  local_120 = local_124;
  local_11c = local_124;
  local_100 = local_104;
  local_fc = local_104;
  local_f8 = local_228;
  uStack_f0 = uStack_220;
  local_e8 = local_228;
  local_e0 = uStack_220;
  local_d8 = local_238;
  uStack_d0 = uStack_230;
  local_c8 = local_238;
  local_c0 = uStack_230;
  iStack_240 = local_104;
  iStack_23c = local_104;
  iStack_110 = local_104;
  iStack_10c = local_104;
  local_248 = local_108;
  iStack_244 = local_104;
  local_118 = local_108;
  iStack_114 = local_104;
  quantize_coeff_phase1
            ((__m128i *)&local_1b8,(__m128i *)&local_248,shift_00,(int)dquanAddr,
             (__m128i *)local_1e8,(__m128i *)local_208,(__m128i *)(local_268 + 2));
  iStack_9c = iStack_23c;
  uStack_98 = (undefined4)local_238;
  local_b8 = local_248;
  iStack_b4 = iStack_244;
  iStack_ac = iStack_23c;
  _local_a8 = CONCAT44(iStack_244,(undefined4)local_238);
  _iStack_240 = CONCAT44(iStack_23c,uStack_a0);
  local_238 = (ulong)(uint)(int)local_190[1];
  local_228 = (ulong)(uint)(int)in_stack_00000018[1];
  local_2c = (int)in_stack_00000018[1];
  local_218 = CONCAT44(local_2c,local_2c);
  uStack_210 = CONCAT44(local_2c,local_2c);
  uStack_230 = local_238;
  uStack_220 = local_228;
  local_90 = local_228;
  local_88 = local_228;
  uStack_80 = local_228;
  local_70 = local_228;
  local_68 = local_228;
  local_60 = local_238;
  local_58 = local_238;
  uStack_50 = local_238;
  local_40 = local_238;
  local_38 = local_238;
  local_28 = local_218;
  uStack_20 = uStack_210;
  local_10 = local_2c;
  local_c = local_2c;
  local_8 = local_2c;
  local_4 = local_2c;
  quantize_coeff_phase2
            ((__m128i *)local_1e8,(__m128i *)local_208,(__m128i *)(local_268 + 2),
             (__m128i *)&local_248,shift_00,(int)dquanAddr,in_stack_00000008,in_stack_00000010);
  local_148 = in_RDI + 2;
  local_1a8 = *local_148;
  lStack_1a0 = in_RDI[3];
  quantize_coeff_phase1
            ((__m128i *)&local_1a8,(__m128i *)&local_248,shift_00,(int)dquanAddr,
             (__m128i *)local_1e8,(__m128i *)local_208,(__m128i *)(local_268 + 2));
  quantize_coeff_phase2
            ((__m128i *)local_1e8,(__m128i *)local_208,(__m128i *)(local_268 + 2),
             (__m128i *)&local_248,shift_00,(int)dquanAddr,in_stack_00000008 + 4,
             in_stack_00000010 + 4);
  find_eob(in_stack_00000008,_coeff_stride,(__m128i *)local_268);
  local_270 = in_RDI;
  while (local_178 = local_178 + -8, 0 < local_178) {
    plVar2 = local_270 + 4;
    qAddr = local_278 + 8;
    _coeff_stride = _coeff_stride + 8;
    local_1b8 = *plVar2;
    lStack_1b0 = local_270[5];
    local_158 = local_270 + 6;
    local_1a8 = *local_158;
    lStack_1a0 = local_270[7];
    local_150 = plVar2;
    quantize_coeff_phase1
              ((__m128i *)&local_1b8,(__m128i *)&local_248,shift_00,(int)dquanAddr,
               (__m128i *)local_1e8,(__m128i *)local_208,(__m128i *)(local_268 + 2));
    quantize_coeff_phase2
              ((__m128i *)local_1e8,(__m128i *)local_208,(__m128i *)(local_268 + 2),
               (__m128i *)&local_248,shift_00,(int)dquanAddr,qAddr,local_280 + 8);
    quantize_coeff_phase1
              ((__m128i *)&local_1a8,(__m128i *)&local_248,shift_00,(int)dquanAddr,
               (__m128i *)local_1e8,(__m128i *)local_208,(__m128i *)(local_268 + 2));
    quantize_coeff_phase2
              ((__m128i *)local_1e8,(__m128i *)local_208,(__m128i *)(local_268 + 2),
               (__m128i *)&local_248,shift_00,(int)dquanAddr,local_278 + 0xc,local_280 + 0xc);
    find_eob(qAddr,_coeff_stride,(__m128i *)local_268);
    local_280 = local_280 + 8;
    local_278 = qAddr;
    local_270 = plVar2;
  }
  uVar1 = get_accumulated_eob((__m128i *)local_268);
  *in_stack_00000020 = uVar1;
  return;
}

Assistant:

void av1_highbd_quantize_fp_sse4_1(
    const tran_low_t *coeff_ptr, intptr_t count, const int16_t *zbin_ptr,
    const int16_t *round_ptr, const int16_t *quant_ptr,
    const int16_t *quant_shift_ptr, tran_low_t *qcoeff_ptr,
    tran_low_t *dqcoeff_ptr, const int16_t *dequant_ptr, uint16_t *eob_ptr,
    const int16_t *scan, const int16_t *iscan, int log_scale) {
  __m128i coeff[2], qcoeff[3], dequant[2], qparam[4], coeff_sign;
  __m128i eob = _mm_setzero_si128();
  const tran_low_t *src = coeff_ptr;
  tran_low_t *quanAddr = qcoeff_ptr;
  tran_low_t *dquanAddr = dqcoeff_ptr;
  const int shift = 16 - log_scale;
  const int coeff_stride = 4;
  const int quan_stride = coeff_stride;
  (void)zbin_ptr;
  (void)quant_shift_ptr;
  (void)scan;

  memset(quanAddr, 0, count * sizeof(quanAddr[0]));
  memset(dquanAddr, 0, count * sizeof(dquanAddr[0]));

  coeff[0] = _mm_loadu_si128((__m128i const *)src);
  const int round1 = ROUND_POWER_OF_TWO(round_ptr[1], log_scale);
  const int round0 = ROUND_POWER_OF_TWO(round_ptr[0], log_scale);

  qparam[0] = _mm_set_epi32(round1, round1, round1, round0);
  qparam[1] = _mm_set_epi64x((uint32_t)quant_ptr[1], (uint32_t)quant_ptr[0]);
  qparam[2] =
      _mm_set_epi64x((uint32_t)dequant_ptr[1], (uint32_t)dequant_ptr[0]);
  qparam[3] = _mm_set_epi32(dequant_ptr[1], dequant_ptr[1], dequant_ptr[1],
                            dequant_ptr[0]);

  // DC and first 3 AC
  quantize_coeff_phase1(&coeff[0], qparam, shift, log_scale, qcoeff, dequant,
                        &coeff_sign);

  // update round/quan/dquan for AC
  qparam[0] = _mm_unpackhi_epi64(qparam[0], qparam[0]);
  qparam[1] = _mm_set1_epi64x((uint32_t)quant_ptr[1]);
  qparam[2] = _mm_set1_epi64x((uint32_t)dequant_ptr[1]);
  qparam[3] = _mm_set1_epi32(dequant_ptr[1]);
  quantize_coeff_phase2(qcoeff, dequant, &coeff_sign, qparam, shift, log_scale,
                        quanAddr, dquanAddr);

  // next 4 AC
  coeff[1] = _mm_loadu_si128((__m128i const *)(src + coeff_stride));
  quantize_coeff_phase1(&coeff[1], qparam, shift, log_scale, qcoeff, dequant,
                        &coeff_sign);
  quantize_coeff_phase2(qcoeff, dequant, &coeff_sign, qparam, shift, log_scale,
                        quanAddr + quan_stride, dquanAddr + quan_stride);

  find_eob(quanAddr, iscan, &eob);

  count -= 8;

  // loop for the rest of AC
  while (count > 0) {
    src += coeff_stride << 1;
    quanAddr += quan_stride << 1;
    dquanAddr += quan_stride << 1;
    iscan += quan_stride << 1;

    coeff[0] = _mm_loadu_si128((__m128i const *)src);
    coeff[1] = _mm_loadu_si128((__m128i const *)(src + coeff_stride));

    quantize_coeff_phase1(&coeff[0], qparam, shift, log_scale, qcoeff, dequant,
                          &coeff_sign);
    quantize_coeff_phase2(qcoeff, dequant, &coeff_sign, qparam, shift,
                          log_scale, quanAddr, dquanAddr);

    quantize_coeff_phase1(&coeff[1], qparam, shift, log_scale, qcoeff, dequant,
                          &coeff_sign);
    quantize_coeff_phase2(qcoeff, dequant, &coeff_sign, qparam, shift,
                          log_scale, quanAddr + quan_stride,
                          dquanAddr + quan_stride);

    find_eob(quanAddr, iscan, &eob);

    count -= 8;
  }
  *eob_ptr = get_accumulated_eob(&eob);
}